

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O3

int Fraig_FindFirstDiff(Fraig_Node_t *pNode1,Fraig_Node_t *pNode2,int fCompl,int iWordLast,
                       int fUseRand)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  if (((ulong)pNode1 & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fraig/fraigTable.c"
                  ,0x189,"int Fraig_FindFirstDiff(Fraig_Node_t *, Fraig_Node_t *, int, int, int)");
  }
  if (((ulong)pNode2 & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fraig/fraigTable.c"
                  ,0x18a,"int Fraig_FindFirstDiff(Fraig_Node_t *, Fraig_Node_t *, int, int, int)");
  }
  if ((*(uint *)&pNode1->field_0x18 & 1 ^ fCompl) == (*(uint *)&pNode2->field_0x18 & 1)) {
    if (fUseRand == 0) {
      if (0 < iWordLast) {
        iVar1 = 0;
        uVar2 = 0;
        do {
          if (pNode1->puSimD[uVar2] != pNode2->puSimD[uVar2]) {
            uVar4 = 0;
            do {
              if (((pNode2->puSimD[uVar2] ^ pNode1->puSimD[uVar2]) >> (uVar4 & 0x1f) & 1) != 0)
              goto LAB_0065f708;
              uVar4 = uVar4 + 1;
            } while (uVar4 != 0x20);
          }
          uVar2 = uVar2 + 1;
          iVar1 = iVar1 + -0x20;
        } while (uVar2 != (uint)iWordLast);
      }
    }
    else if (0 < iWordLast) {
      iVar1 = 0;
      uVar2 = 0;
      do {
        if (pNode1->puSimR[uVar2] != pNode2->puSimR[uVar2]) {
          uVar4 = 0;
          do {
            if (((pNode2->puSimR[uVar2] ^ pNode1->puSimR[uVar2]) >> (uVar4 & 0x1f) & 1) != 0) {
LAB_0065f708:
              return uVar4 - iVar1;
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 != 0x20);
        }
        uVar2 = uVar2 + 1;
        iVar1 = iVar1 + -0x20;
      } while (uVar2 != (uint)iWordLast);
    }
  }
  else if (fUseRand == 0) {
    if (0 < iWordLast) {
      iVar1 = 0;
      uVar2 = 0;
      do {
        uVar3 = pNode2->puSimD[uVar2] ^ pNode1->puSimD[uVar2];
        if (uVar3 != 0xffffffff) {
          uVar4 = 0;
          do {
            if ((uVar3 >> (uVar4 & 0x1f) & 1) == 0) goto LAB_0065f708;
            uVar4 = uVar4 + 1;
          } while (uVar4 != 0x20);
        }
        uVar2 = uVar2 + 1;
        iVar1 = iVar1 + -0x20;
      } while (uVar2 != (uint)iWordLast);
    }
  }
  else if (0 < iWordLast) {
    iVar1 = 0;
    uVar2 = 0;
    do {
      uVar3 = pNode2->puSimR[uVar2] ^ pNode1->puSimR[uVar2];
      if (uVar3 != 0xffffffff) {
        uVar4 = 0;
        do {
          if ((uVar3 >> (uVar4 & 0x1f) & 1) == 0) goto LAB_0065f708;
          uVar4 = uVar4 + 1;
        } while (uVar4 != 0x20);
      }
      uVar2 = uVar2 + 1;
      iVar1 = iVar1 + -0x20;
    } while (uVar2 != (uint)iWordLast);
  }
  return -1;
}

Assistant:

int Fraig_FindFirstDiff( Fraig_Node_t * pNode1, Fraig_Node_t * pNode2, int fCompl, int iWordLast, int fUseRand )
{
    int i, v;
    assert( !Fraig_IsComplement(pNode1) );
    assert( !Fraig_IsComplement(pNode2) );
    // take into account possible internal complementation
    fCompl ^= pNode1->fInv;
    fCompl ^= pNode2->fInv;
    // find the pattern
    if ( fCompl )
    {
        if ( fUseRand )
        {
            for ( i = 0; i < iWordLast; i++ )
                if ( pNode1->puSimR[i] != ~pNode2->puSimR[i] )
                    for ( v = 0; v < 32; v++ )
                        if ( (pNode1->puSimR[i] ^ ~pNode2->puSimR[i]) & (1 << v) )
                            return i * 32 + v;
        }
        else
        {
            for ( i = 0; i < iWordLast; i++ )
                if ( pNode1->puSimD[i] !=  ~pNode2->puSimD[i] )
                    for ( v = 0; v < 32; v++ )
                        if ( (pNode1->puSimD[i] ^ ~pNode2->puSimD[i]) & (1 << v) )
                            return i * 32 + v;
        }
    }
    else
    {
        if ( fUseRand )
        {
            for ( i = 0; i < iWordLast; i++ )
                if ( pNode1->puSimR[i] != pNode2->puSimR[i] )
                    for ( v = 0; v < 32; v++ )
                        if ( (pNode1->puSimR[i] ^ pNode2->puSimR[i]) & (1 << v) )
                            return i * 32 + v;
        }
        else
        {
            for ( i = 0; i < iWordLast; i++ )
                if ( pNode1->puSimD[i] !=  pNode2->puSimD[i] )
                    for ( v = 0; v < 32; v++ )
                        if ( (pNode1->puSimD[i] ^ pNode2->puSimD[i]) & (1 << v) )
                            return i * 32 + v;
        }
    }
    return -1;
}